

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O3

DASHEventMessageBoxv1 *
generate_event_message_vtt_time
          (DASHEventMessageBoxv1 *__return_storage_ptr__,uint32_t id,uint64_t presentation_time,
          uint64_t duration,uint32_t timescale,uint32_t off)

{
  pointer puVar1;
  pointer puVar2;
  tm *__tp;
  uint uVar3;
  int k;
  uint64_t uVar4;
  long lVar5;
  time_t epochTime;
  char timestamp [64];
  uchar local_159;
  uint local_158;
  uint32_t local_154;
  uint64_t local_150;
  string *local_148;
  string *local_140;
  string *local_138;
  string *local_130;
  undefined8 *local_128;
  undefined1 *local_120;
  uint64_t local_118;
  long local_110;
  undefined **local_108;
  undefined8 uStack_100;
  uint64_t uStack_f8;
  ulong *local_f0;
  undefined8 local_e8;
  ulong auStack_e0 [4];
  pointer local_c0;
  undefined3 uStack_b8;
  undefined5 uStack_b5;
  undefined3 local_b0;
  undefined5 uStack_ad;
  undefined2 local_a8;
  undefined1 local_a6;
  undefined5 uStack_a5;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined8 local_9c;
  undefined8 uStack_94;
  uint32_t local_8c;
  undefined1 *local_88 [2];
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68 [2];
  undefined1 local_58;
  undefined7 uStack_57;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  local_140 = (string *)&(__return_storage_ptr__->super_full_box).super_box.box_type_;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_full_box).super_box.box_type_.field_2;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_string_length = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  local_128 = (undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.field_0x62;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.field_0x64 = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 3) = 0;
  (__return_storage_ptr__->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00121a88;
  local_148 = (string *)&__return_storage_ptr__->scheme_id_uri_;
  (__return_storage_ptr__->scheme_id_uri_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->scheme_id_uri_).field_2;
  (__return_storage_ptr__->scheme_id_uri_)._M_string_length = 0;
  (__return_storage_ptr__->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  local_138 = (string *)&__return_storage_ptr__->value_;
  (__return_storage_ptr__->value_)._M_string_length = 0;
  (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158 = timescale;
  local_154 = id;
  local_150 = presentation_time;
  local_118 = duration;
  memset(&uStack_100,0,0xb8);
  auStack_e0[0] = auStack_e0[0] & 0xffffffffffffff00;
  uStack_a0 = 0;
  uStack_9e = 0;
  local_c0 = (pointer)0x0;
  uStack_b8 = 0;
  uStack_b5 = 0;
  local_b0 = 0;
  uStack_ad = 0;
  local_a8 = 0;
  local_a6 = 0;
  local_108 = &PTR_size_00121a88;
  local_130 = (string *)local_88;
  local_120 = &local_78;
  local_78 = 0;
  local_58 = 0;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.size_ = uStack_100;
  (__return_storage_ptr__->super_full_box).super_box.large_size_ = uStack_f8;
  local_f0 = auStack_e0;
  local_88[0] = local_120;
  local_68[0] = &local_58;
  std::__cxx11::string::operator=(local_140,(string *)&local_f0);
  *(ulong *)(__return_storage_ptr__->super_full_box).super_box.extended_type_ = auStack_e0[2];
  *(ulong *)((__return_storage_ptr__->super_full_box).super_box.extended_type_ + 8) = auStack_e0[3];
  puVar1 = (__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_c0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT53(uStack_b5,uStack_b8);
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT53(uStack_ad,local_b0);
  local_c0 = (pointer)0x0;
  uStack_b8 = 0;
  uStack_b5 = 0;
  local_b0 = 0;
  uStack_ad = 0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  (__return_storage_ptr__->super_full_box).super_box.is_large_ = (bool)(undefined1)local_a8;
  (__return_storage_ptr__->super_full_box).super_box.has_uuid_ = (bool)local_a8._1_1_;
  *(undefined2 *)(local_128 + 1) = uStack_9e;
  *local_128 = CONCAT26(uStack_a0,CONCAT51(uStack_a5,local_a6));
  __return_storage_ptr__->id_ = local_8c;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).field_0x6c = local_9c;
  *(undefined8 *)((long)&__return_storage_ptr__->presentation_time_ + 4) = uStack_94;
  std::__cxx11::string::operator=(local_148,local_130);
  std::__cxx11::string::operator=(local_138,(string *)local_68);
  puVar1 = (__return_storage_ptr__->message_data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->message_data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_40;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    local_108 = &PTR_size_00121a88;
    uVar4 = local_150;
    uVar3 = local_158;
  }
  else {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    uVar4 = local_150;
    uVar3 = local_158;
    local_108 = &PTR_size_00121a88;
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  if (local_68[0] != &local_58) {
    operator_delete(local_68[0],CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_88[0] != local_120) {
    operator_delete(local_88[0],CONCAT71(uStack_77,local_78) + 1);
  }
  local_108 = &PTR_size_00121ad0;
  if (local_c0 != (pointer)0x0) {
    operator_delete(local_c0,CONCAT53(uStack_ad,local_b0) - (long)local_c0);
  }
  if (local_f0 != auStack_e0) {
    operator_delete(local_f0,auStack_e0[0] + 1);
  }
  __return_storage_ptr__->id_ = local_154;
  __return_storage_ptr__->presentation_time_ = uVar4;
  __return_storage_ptr__->event_duration_ = (uint32_t)local_118;
  *(uint *)&(__return_storage_ptr__->super_full_box).field_0x6c = uVar3;
  std::__cxx11::string::_M_replace
            ((ulong)local_148,0,(char *)(__return_storage_ptr__->scheme_id_uri_)._M_string_length,
             0x11a061);
  auStack_e0[1] = 0;
  auStack_e0[2] = 0;
  local_e8 = 0;
  auStack_e0[0] = 0;
  uStack_f8 = 0;
  local_f0 = (ulong *)0x0;
  local_108 = (undefined **)0x0;
  uStack_100 = 0;
  local_110 = (long)uVar4 / (long)(ulong)uVar3;
  __tp = gmtime(&local_110);
  strftime((char *)&local_108,0x40,"%Y-%m-%d %H:%M:%S",__tp);
  lVar5 = 0;
  do {
    local_159 = *(uchar *)((long)&local_108 + lVar5);
    if (local_159 != '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&__return_storage_ptr__->message_data_,&local_159);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 generate_event_message_vtt_time(
    uint32_t id,
    uint64_t presentation_time,
    uint64_t duration,
    uint32_t timescale,
    uint32_t off)
{

    event_track::DASHEventMessageBoxv1 ev;
    ev = {};
    ev.id_ = id;
    ev.presentation_time_ = presentation_time;
    ev.event_duration_ = (uint32_t)duration;
    ev.timescale_ = timescale;
    ev.scheme_id_uri_ = "urn:webvtt";

    //static std::string getTimeStamp(time_t epochTime, const char* format = "%Y-%m-%d %H:%M:%S")
    //{
    char timestamp[64] = { 0 };
    const char* format = "%Y-%m-%d %H:%M:%S";
    std::time_t epochTime = (time_t) presentation_time / timescale;
    std::strftime(timestamp, sizeof(timestamp), format, gmtime(&epochTime));
    
    for (int k = 0; k < 64; k++)
        if(timestamp[k] != '\0')
           ev.message_data_.push_back(timestamp[k]);

    return ev;
}